

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderNextSibling(xmlTextReaderPtr reader)

{
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->doc == (xmlDocPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->state == XML_TEXTREADER_END) {
    reader_local._4_4_ = 0;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local._4_4_ = xmlTextReaderNextTree(reader);
  }
  else if (reader->node->next == (_xmlNode *)0x0) {
    reader_local._4_4_ = 0;
  }
  else {
    reader->node = reader->node->next;
    reader->state = XML_TEXTREADER_START;
    reader_local._4_4_ = 1;
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderNextSibling(xmlTextReaderPtr reader) {
    if (reader == NULL)
        return(-1);
    if (reader->doc == NULL) {
        /* TODO */
	return(-1);
    }

    if (reader->state == XML_TEXTREADER_END)
        return(0);

    if (reader->node == NULL)
        return(xmlTextReaderNextTree(reader));

    if (reader->node->next != NULL) {
        reader->node = reader->node->next;
        reader->state = XML_TEXTREADER_START;
        return(1);
    }

    return(0);
}